

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::KdTreeAggregate::Intersect(KdTreeAggregate *this,Ray *ray,Float raytMax)

{
  bool bVar1;
  int iVar2;
  float *pfVar3;
  const_reference pvVar4;
  ShapeIntersection *pSVar5;
  Tuple3<pbrt::Point3,_float> *in_RDX;
  long in_RSI;
  optional<pbrt::ShapeIntersection> *in_RDI;
  long *in_FS_OFFSET;
  float in_XMM0_Da;
  Float FVar6;
  float fVar7;
  optional<pbrt::ShapeIntersection> primSi_1;
  PrimitiveHandle *p_1;
  int index;
  int i;
  optional<pbrt::ShapeIntersection> primSi;
  PrimitiveHandle *p;
  int nPrimitives;
  int belowFirst;
  KdAccelNode *secondChild;
  KdAccelNode *firstChild;
  Float tSplit;
  int axis;
  KdAccelNode *node;
  int nodesVisited;
  int todoPos;
  KdToDo todo [64];
  int maxTodo;
  Vector3f invDir;
  Float tMax;
  Float tMin;
  optional<pbrt::ShapeIntersection> *si;
  undefined8 in_stack_fffffffffffff8c8;
  undefined7 in_stack_fffffffffffff8d0;
  undefined1 in_stack_fffffffffffff8d7;
  optional<pbrt::ShapeIntersection> *in_stack_fffffffffffff8d8;
  undefined4 in_stack_fffffffffffff8e0;
  long in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff8f0;
  int in_stack_fffffffffffff8f4;
  PrimitiveHandle *in_stack_fffffffffffff8f8;
  Float in_stack_fffffffffffff904;
  undefined4 in_stack_fffffffffffff908;
  undefined4 in_stack_fffffffffffff90c;
  undefined4 in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff914;
  undefined4 in_stack_fffffffffffff918;
  uint uVar8;
  undefined4 in_stack_fffffffffffff91c;
  optional local_6a8 [264];
  const_reference local_5a0;
  int local_598;
  int local_594;
  optional local_590 [264];
  const_reference local_488;
  int local_480;
  uint local_47c;
  KdAccelNode *local_478;
  KdAccelNode *local_470;
  float local_464;
  int local_460;
  KdAccelNode *local_450;
  undefined1 local_441;
  int local_440;
  int local_43c;
  long local_438;
  float afStack_430 [255];
  undefined4 local_34;
  Tuple3<pbrt::Vector3,_float> local_30;
  float local_24;
  float local_20;
  float local_1c;
  Tuple3<pbrt::Point3,_float> *local_18;
  
  local_1c = in_XMM0_Da;
  local_18 = in_RDX;
  bVar1 = Bounds3<float>::IntersectP
                    ((Bounds3<float> *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918)
                     ,(Point3f *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                     (Vector3f *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                     in_stack_fffffffffffff904,(Float *)in_stack_fffffffffffff8f8,
                     (Float *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  if (bVar1) {
    Vector3<float>::Vector3
              ((Vector3<float> *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
               (float)((ulong)in_stack_fffffffffffff8c8 >> 0x20),(float)in_stack_fffffffffffff8c8,
               0.0);
    local_34 = 0x40;
    local_43c = 0;
    local_440 = 0;
    local_441 = 0;
    pstd::optional<pbrt::ShapeIntersection>::optional(in_RDI);
    local_450 = *(KdAccelNode **)(in_RSI + 0x40);
    while ((local_450 != (KdAccelNode *)0x0 && (local_20 <= local_1c))) {
      local_440 = local_440 + 1;
      bVar1 = KdAccelNode::IsLeaf(local_450);
      if (bVar1) {
        iVar2 = KdAccelNode::nPrimitives(local_450);
        local_480 = iVar2;
        if (iVar2 == 1) {
          local_488 = std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::
                      operator[]((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                                  *)(in_RSI + 0x10),(long)(local_450->field_0).onePrimitive);
          PrimitiveHandle::Intersect
                    (in_stack_fffffffffffff8f8,
                     (Ray *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                     (Float)((ulong)in_stack_fffffffffffff8e8 >> 0x20));
          bVar1 = pstd::optional::operator_cast_to_bool(local_590);
          in_stack_fffffffffffff8e0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff8e0);
          if (bVar1) {
            pstd::optional<pbrt::ShapeIntersection>::operator=
                      ((optional<pbrt::ShapeIntersection> *)
                       CONCAT44(iVar2,in_stack_fffffffffffff8e0),in_stack_fffffffffffff8d8);
            in_stack_fffffffffffff8d8 =
                 (optional<pbrt::ShapeIntersection> *)
                 pstd::optional<pbrt::ShapeIntersection>::operator->
                           ((optional<pbrt::ShapeIntersection> *)0x7c0edc);
            local_1c = *(Float *)((long)&in_stack_fffffffffffff8d8->optionalValue + 0xf8);
          }
          pstd::optional<pbrt::ShapeIntersection>::~optional
                    ((optional<pbrt::ShapeIntersection> *)0x7c0f2e);
        }
        else {
          for (local_594 = 0; local_594 < local_480; local_594 = local_594 + 1) {
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x28),
                                (long)((local_450->field_0).onePrimitive + local_594));
            local_598 = *pvVar4;
            local_5a0 = std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::
                        operator[]((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                                    *)(in_RSI + 0x10),(long)local_598);
            PrimitiveHandle::Intersect
                      (in_stack_fffffffffffff8f8,
                       (Ray *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                       (Float)((ulong)in_stack_fffffffffffff8e8 >> 0x20));
            bVar1 = pstd::optional::operator_cast_to_bool(local_6a8);
            if (bVar1) {
              pstd::optional<pbrt::ShapeIntersection>::operator=
                        ((optional<pbrt::ShapeIntersection> *)
                         CONCAT44(iVar2,in_stack_fffffffffffff8e0),in_stack_fffffffffffff8d8);
              pSVar5 = pstd::optional<pbrt::ShapeIntersection>::operator->
                                 ((optional<pbrt::ShapeIntersection> *)0x7c1006);
              local_1c = pSVar5->tHit;
            }
            pstd::optional<pbrt::ShapeIntersection>::~optional
                      ((optional<pbrt::ShapeIntersection> *)0x7c1056);
          }
        }
        if (local_43c < 1) break;
        local_43c = local_43c + -1;
        local_450 = (KdAccelNode *)(&local_438)[(long)local_43c * 2];
        local_20 = afStack_430[(long)local_43c * 4];
        local_24 = afStack_430[(long)local_43c * 4 + 1];
      }
      else {
        local_460 = KdAccelNode::SplitAxis(local_450);
        FVar6 = KdAccelNode::SplitPos(local_450);
        fVar7 = Tuple3<pbrt::Point3,_float>::operator[](local_18,local_460);
        pfVar3 = Tuple3<pbrt::Vector3,_float>::operator[](&local_30,local_460);
        local_464 = (FVar6 - fVar7) * *pfVar3;
        fVar7 = Tuple3<pbrt::Point3,_float>::operator[](local_18,local_460);
        FVar6 = KdAccelNode::SplitPos(local_450);
        uVar8 = 0x1000000;
        if (FVar6 <= fVar7) {
          fVar7 = Tuple3<pbrt::Point3,_float>::operator[](local_18,local_460);
          FVar6 = KdAccelNode::SplitPos(local_450);
          bVar1 = false;
          if ((fVar7 == FVar6) && (!NAN(fVar7) && !NAN(FVar6))) {
            fVar7 = Tuple3<pbrt::Vector3,_float>::operator[]
                              ((Tuple3<pbrt::Vector3,_float> *)(local_18 + 1),local_460);
            bVar1 = fVar7 <= 0.0;
          }
          uVar8 = (uint)bVar1 << 0x18;
        }
        local_47c = uVar8 >> 0x18;
        if (local_47c == 0) {
          in_stack_fffffffffffff8e8 = *(long *)(in_RSI + 0x40);
          in_stack_fffffffffffff8f4 = KdAccelNode::AboveChild(local_450);
          local_470 = (KdAccelNode *)
                      (in_stack_fffffffffffff8e8 + (long)in_stack_fffffffffffff8f4 * 8);
          local_478 = local_450 + 1;
        }
        else {
          local_470 = local_450 + 1;
          in_stack_fffffffffffff8f8 = *(PrimitiveHandle **)(in_RSI + 0x40);
          iVar2 = KdAccelNode::AboveChild(local_450);
          local_478 = (KdAccelNode *)(in_stack_fffffffffffff8f8 + iVar2);
        }
        if ((local_24 < local_464) || (local_464 <= 0.0)) {
          local_450 = local_470;
        }
        else if (local_20 <= local_464) {
          (&local_438)[(long)local_43c * 2] = (long)local_478;
          afStack_430[(long)local_43c * 4] = local_464;
          afStack_430[(long)local_43c * 4 + 1] = local_24;
          local_43c = local_43c + 1;
          local_450 = local_470;
          local_24 = local_464;
        }
        else {
          local_450 = local_478;
        }
      }
    }
    *(long *)(*in_FS_OFFSET + -0x3f0) = (long)local_440 + *(long *)(*in_FS_OFFSET + -0x3f0);
  }
  else {
    memset(in_RDI,0,0x108);
    pstd::optional<pbrt::ShapeIntersection>::optional(in_RDI);
  }
  return in_RDI;
}

Assistant:

pstd::optional<ShapeIntersection> KdTreeAggregate::Intersect(const Ray &ray,
                                                             Float raytMax) const {
    // Compute initial parametric range of ray inside kd-tree extent
    Float tMin, tMax;
    if (!bounds.IntersectP(ray.o, ray.d, raytMax, &tMin, &tMax))
        return {};

    // Prepare to traverse kd-tree for ray
    Vector3f invDir(1 / ray.d.x, 1 / ray.d.y, 1 / ray.d.z);
    constexpr int maxTodo = 64;
    KdToDo todo[maxTodo];
    int todoPos = 0;
    int nodesVisited = 0;

    // Traverse kd-tree nodes in order for ray
    pstd::optional<ShapeIntersection> si;
    const KdAccelNode *node = &nodes[0];
    while (node != nullptr) {
        // Bail out if we found a hit closer than the current node
        if (raytMax < tMin)
            break;

        ++nodesVisited;
        if (!node->IsLeaf()) {
            // Process kd-tree interior node
            // Compute parametric distance along ray to split plane
            int axis = node->SplitAxis();
            Float tSplit = (node->SplitPos() - ray.o[axis]) * invDir[axis];

            // Get node children pointers for ray
            const KdAccelNode *firstChild, *secondChild;
            int belowFirst = (ray.o[axis] < node->SplitPos()) ||
                             (ray.o[axis] == node->SplitPos() && ray.d[axis] <= 0);
            if (belowFirst) {
                firstChild = node + 1;
                secondChild = &nodes[node->AboveChild()];
            } else {
                firstChild = &nodes[node->AboveChild()];
                secondChild = node + 1;
            }

            // Advance to next child node, possibly enqueue other child
            if (tSplit > tMax || tSplit <= 0)
                node = firstChild;
            else if (tSplit < tMin)
                node = secondChild;
            else {
                // Enqueue _secondChild_ in todo list
                todo[todoPos].node = secondChild;
                todo[todoPos].tMin = tSplit;
                todo[todoPos].tMax = tMax;
                ++todoPos;

                node = firstChild;
                tMax = tSplit;
            }

        } else {
            // Check for intersections inside leaf node
            int nPrimitives = node->nPrimitives();
            if (nPrimitives == 1) {
                const PrimitiveHandle &p = primitives[node->onePrimitive];
                // Check one primitive inside leaf node
                pstd::optional<ShapeIntersection> primSi = p.Intersect(ray, raytMax);
                if (primSi) {
                    si = primSi;
                    raytMax = si->tHit;
                }

            } else {
                for (int i = 0; i < nPrimitives; ++i) {
                    int index = primitiveIndices[node->primitiveIndicesOffset + i];
                    const PrimitiveHandle &p = primitives[index];
                    // Check one primitive inside leaf node
                    pstd::optional<ShapeIntersection> primSi = p.Intersect(ray, raytMax);
                    if (primSi) {
                        si = primSi;
                        raytMax = si->tHit;
                    }
                }
            }

            // Grab next node to process from todo list
            if (todoPos > 0) {
                --todoPos;
                node = todo[todoPos].node;
                tMin = todo[todoPos].tMin;
                tMax = todo[todoPos].tMax;
            } else
                break;
        }
    }
    kdNodesVisited += nodesVisited;
    return si;
}